

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

bool __thiscall
pybind11::detail::tuple_caster<std::pair,Eigen::Matrix<double,1,3,1,1,3>,double>::load_impl<0ul,1ul>
          (tuple_caster<std::pair,Eigen::Matrix<double,1,3,1,1,3>,double> *this,undefined8 *seq,
          bool convert)

{
  bool bVar1;
  bool bVar2;
  handle local_78;
  handle local_70 [2];
  undefined8 local_60;
  undefined8 local_58;
  object local_50 [2];
  undefined8 local_40;
  undefined8 local_38;
  object oStack_30;
  
  local_40 = *seq;
  local_38 = 0;
  oStack_30.super_handle.m_ptr = (handle)(PyObject *)0x0;
  accessor::operator_cast_to_object((accessor *)local_70);
  bVar1 = type_caster<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_void>::load
                    ((type_caster<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_void> *)this,local_70[0],
                     convert);
  local_60 = *seq;
  local_58 = 1;
  local_50[0].super_handle.m_ptr = (handle)(PyObject *)0x0;
  accessor::operator_cast_to_object((accessor *)&local_78);
  bVar2 = type_caster<double,_void>::load
                    ((type_caster<double,_void> *)(this + 0x18),local_78,convert);
  pybind11::object::~object((object *)&local_78);
  pybind11::object::~object(local_50);
  pybind11::object::~object((object *)local_70);
  pybind11::object::~object(&oStack_30);
  return bVar1 && bVar2;
}

Assistant:

bool load_impl(const sequence &seq, bool convert, index_sequence<Is...>) {
        for (bool r : {std::get<Is>(subcasters).load(seq[Is], convert)...})
            if (!r)
                return false;
        return true;
    }